

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

bool __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseCDATA
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  char *c;
  char *pcVar6;
  char cVar7;
  bool bVar8;
  string<char> local_28;
  
  pcVar2 = this->P;
  cVar1 = pcVar2[1];
  if ((cVar1 == '[') && (this->CurrentNodeType = EXN_CDATA, *pcVar2 != '\0')) {
    uVar4 = 0;
    c = pcVar2;
    do {
      pcVar6 = c;
      c = pcVar6 + 1;
      this->P = c;
      uVar3 = uVar4 + 1;
      cVar7 = *c;
      if (cVar7 == '\0') break;
      bVar8 = uVar4 < 7;
      uVar4 = uVar3;
    } while (bVar8);
    if (cVar7 != '\0') {
      pcVar6 = pcVar6 + -1;
      do {
        if ((cVar7 == '>') && (pcVar6[1] == ']')) {
          pcVar5 = (char *)0x0;
          if (*pcVar6 == ']') {
            pcVar5 = pcVar6;
          }
        }
        else {
          pcVar5 = (char *)0x0;
        }
        this->P = pcVar6 + 3;
        cVar7 = pcVar6[3];
      } while ((cVar7 != '\0') && (pcVar6 = pcVar6 + 1, pcVar5 == (char *)0x0));
      if (pcVar5 == (char *)0x0) {
        core::string<char>::operator=(&this->NodeName,"");
      }
      else {
        core::string<char>::string<char>(&local_28,c,((int)pcVar5 - (int)pcVar2) - uVar3);
        core::string<char>::operator=(&this->NodeName,&local_28);
        if (local_28.array != (char *)0x0) {
          operator_delete__(local_28.array);
        }
      }
    }
  }
  return cVar1 == '[';
}

Assistant:

bool parseCDATA()
	{
		if (*(P+1) != L'[')
			return false;

		CurrentNodeType = EXN_CDATA;

		// skip '<![CDATA['
		int count=0;
		while( *P && count<8 )
		{
			++P;
			++count;
		}

		if (!*P)
			return true;

		char_type *cDataBegin = P;
		char_type *cDataEnd = 0;

		// find end of CDATA
		while(*P && !cDataEnd)
		{
			if (*P == L'>' && 
			   (*(P-1) == L']') &&
			   (*(P-2) == L']'))
			{
				cDataEnd = P - 2;
			}

			++P;
		}

		if ( cDataEnd )
			NodeName = core::string<char_type>(cDataBegin, (int)(cDataEnd - cDataBegin));
		else
			NodeName = "";

		return true;
	}